

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_resize
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  uint uVar1;
  Error EVar2;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  ZoneAllocator *in_RDI;
  Error _err;
  uint32_t size;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = *(uint *)(in_RDI + 8);
  if (*(uint *)(in_RDI + 0xc) < in_ECX) {
    EVar2 = _grow((ZoneVectorBase *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI);
    if (EVar2 != 0) {
      return EVar2;
    }
    if (*(uint *)(in_RDI + 0xc) < in_ECX) {
      DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
    }
  }
  if (uVar1 < in_ECX) {
    memset((void *)(*(long *)in_RDI + (ulong)uVar1 * (ulong)in_EDX),0,
           (ulong)(in_ECX - uVar1) * (ulong)in_EDX);
  }
  *(uint *)(in_RDI + 8) = in_ECX;
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t size = _size;

  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(allocator, sizeOfT, n - size));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (size < n)
    memset(static_cast<uint8_t*>(_data) + size_t(size) * sizeOfT, 0, size_t(n - size) * sizeOfT);

  _size = n;
  return kErrorOk;
}